

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O3

void __thiscall
WorldShuffler::randomize_oracle_stone_hint(WorldShuffler *this,Item *forbidden_fortune_teller_item)

{
  uchar *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  RandomizerWorld *pRVar4;
  WorldNode *end_node;
  WorldNode *start_node;
  pointer ppIVar5;
  Item *item;
  size_type sVar6;
  undefined8 uVar7;
  bool bVar8;
  HintSource *this_00;
  mapped_type *ppIVar9;
  mapped_type *ppWVar10;
  __normal_iterator<Item_*const_*,_std::vector<Item_*,_std::allocator<Item_*>_>_> _Var11;
  ostream *poVar12;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var13;
  LandstalkerException *this_01;
  uchar *puVar14;
  vector<Item_*,_std::allocator<Item_*>_> *__range4;
  undefined1 *puVar15;
  pointer ppIVar16;
  _Alloc_hider _Var17;
  initializer_list<Item_*> __l;
  vector<Item_*,_std::allocator<Item_*>_> min_items_to_reach;
  vector<Item_*,_std::allocator<Item_*>_> hintable_items;
  vector<Item_*,_std::allocator<Item_*>_> forbidden_items;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources;
  WorldSolver solver;
  string local_228;
  vector<Item_*,_std::allocator<Item_*>_> local_208;
  vector<Item_*,_std::allocator<Item_*>_> local_1e8;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  mapped_type local_198;
  mapped_type local_190;
  ios_base local_138 [264];
  
  pRVar4 = this->_world;
  pcVar3 = local_1b8 + 0x10;
  local_1b8._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Oracle Stone","");
  this_00 = RandomizerWorld::hint_source(pRVar4,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar3) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  HintSource::text_abi_cxx11_((string *)local_1b8,this_00);
  uVar7 = local_1b8._8_8_;
  if ((pointer)local_1b8._0_8_ != pcVar3) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
  }
  pRVar4 = this->_world;
  local_1b8._0_8_ = this_00;
  if ((WorldNode *)uVar7 != (WorldNode *)0x0) {
    std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
              ((vector<HintSource*,std::allocator<HintSource*>> *)&pRVar4->_used_hint_sources,
               (HintSource **)local_1b8);
    return;
  }
  if ((pRVar4->_item_quantities)._M_elems[0x30] != 0) {
    std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
              ((vector<HintSource*,std::allocator<HintSource*>> *)&pRVar4->_used_hint_sources,
               (HintSource **)local_1b8);
    local_228._M_dataplus._M_p._0_1_ = 0x28;
    local_1b8._0_8_ = forbidden_fortune_teller_item;
    ppIVar9 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this->_world,(key_type_conflict *)&local_228);
    local_1b8._8_8_ = *ppIVar9;
    local_228._M_dataplus._M_p._0_1_ = 0x2a;
    ppIVar9 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this->_world,(key_type_conflict *)&local_228);
    local_1a8._M_allocated_capacity = (size_type)*ppIVar9;
    local_228._M_dataplus._M_p._0_1_ = 0x34;
    ppIVar9 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this->_world,(key_type_conflict *)&local_228);
    local_1a8._8_8_ = *ppIVar9;
    local_228._M_dataplus._M_p._0_1_ = 0x21;
    ppIVar9 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this->_world,(key_type_conflict *)&local_228);
    local_198 = *ppIVar9;
    local_228._M_dataplus._M_p._0_1_ = 0x22;
    ppIVar9 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)this->_world,(key_type_conflict *)&local_228);
    local_190 = *ppIVar9;
    __l._M_len = 6;
    __l._M_array = (iterator)local_1b8;
    std::vector<Item_*,_std::allocator<Item_*>_>::vector
              (&local_1e8,__l,(allocator_type *)&local_228);
    pRVar4 = this->_world;
    local_1b8[0] = 0x30;
    ppIVar9 = std::
              map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
              ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                    *)pRVar4,local_1b8);
    RandomizerWorld::item_sources_with_item(&local_1d0,pRVar4,*ppIVar9);
    if (local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    ppWVar10 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&this->_world->_nodes,
                    &(*local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                       _M_impl.super__Vector_impl_data._M_start)->_node_id);
    end_node = *ppWVar10;
    if (end_node != (WorldNode *)0x0) {
      WorldSolver::WorldSolver((WorldSolver *)local_1b8,this->_world);
      ppWVar10 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
                 ::at(&this->_world->_nodes,&this->_world->_spawn_location->_node_id);
      start_node = *ppWVar10;
      World::starting_inventory
                ((vector<Item_*,_std::allocator<Item_*>_> *)&local_228,&this->_world->super_World);
      bVar8 = WorldSolver::try_to_solve
                        ((WorldSolver *)local_1b8,start_node,end_node,
                         (vector<Item_*,_std::allocator<Item_*>_> *)&local_228);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_228._M_dataplus._M_p,
                        local_228.field_2._M_allocated_capacity - (long)local_228._M_dataplus._M_p);
      }
      if (!bVar8) {
        paVar2 = &local_228.field_2;
        local_228._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"./debug.json","");
        dump_json_to_file(&(this->_solver)._debug_log,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != paVar2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        this_01 = (LandstalkerException *)__cxa_allocate_exception(0x28);
        local_228._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_228,"Could not find minimal inventory to reach Oracle Stone","")
        ;
        LandstalkerException::LandstalkerException(this_01,&local_228);
        __cxa_throw(this_01,&LandstalkerException::typeinfo,
                    LandstalkerException::~LandstalkerException);
      }
      WorldSolver::find_minimal_inventory
                ((vector<Item_*,_std::allocator<Item_*>_> *)&local_228,(WorldSolver *)local_1b8);
      sVar6 = local_228._M_string_length;
      if (local_228._M_dataplus._M_p != (pointer)local_228._M_string_length) {
        _Var17._M_p = local_228._M_dataplus._M_p;
        do {
          local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_start = *(pointer *)_Var17._M_p;
          _Var11 = std::
                   __find_if<__gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                             (local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                              super__Vector_impl_data._M_finish,&local_208);
          if (_Var11._M_current ==
              local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                      ((vector<Item*,std::allocator<Item*>> *)&local_1e8,(Item **)&local_208);
          }
          _Var17._M_p = _Var17._M_p + 8;
        } while (_Var17._M_p != (pointer)sVar6);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_228._M_dataplus._M_p,
                        local_228.field_2._M_allocated_capacity - (long)local_228._M_dataplus._M_p);
      }
      WorldSolver::~WorldSolver((WorldSolver *)local_1b8);
    }
    local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ppIVar16 = (this->_minimal_items_to_complete).
               super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
               _M_start;
    ppIVar5 = (this->_minimal_items_to_complete).super__Vector_base<Item_*,_std::allocator<Item_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppIVar16 != ppIVar5) {
      do {
        local_1b8._0_8_ = *ppIVar16;
        _Var11 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Item*const*,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                           (local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_finish,local_1b8);
        if (_Var11._M_current ==
            local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                    ((vector<Item*,std::allocator<Item*>> *)&local_208,(Item **)local_1b8);
        }
        ppIVar16 = ppIVar16 + 1;
      } while (ppIVar16 != ppIVar5);
      if (local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        vectools::shuffle<Item*>(&local_208,&this->_rng);
        item = *local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 0x10),"You will need ",0xe);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_1b8 + 0x10),(item->_name)._M_dataplus._M_p,
                             (item->_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,". It is ",8);
        random_hint_for_item_abi_cxx11_(&local_228,this,item);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&this_00->_text,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        local_228._M_dataplus._M_p._0_1_ = item->_id;
        _Var13 = std::
                 __find_if<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                           ((this->_hintable_item_requirements).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (this->_hintable_item_requirements).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        puVar14 = (this->_hintable_item_requirements).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (_Var13._M_current != puVar14) {
          puVar1 = _Var13._M_current + 1;
          if (puVar1 != puVar14) {
            memmove(_Var13._M_current,puVar1,(long)puVar14 - (long)puVar1);
            puVar14 = (this->_hintable_item_requirements).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          (this->_hintable_item_requirements).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar14 + -1;
        }
        local_228._M_dataplus._M_p._0_1_ = item->_id;
        _Var13 = std::
                 __find_if<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                           ((this->_hintable_item_locations).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (this->_hintable_item_locations).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        puVar14 = (this->_hintable_item_locations).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (_Var13._M_current != puVar14) {
          puVar1 = _Var13._M_current + 1;
          if (puVar1 != puVar14) {
            memmove(_Var13._M_current,puVar1,(long)puVar14 - (long)puVar1);
            puVar14 = (this->_hintable_item_locations).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          (this->_hintable_item_locations).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar14 + -1;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1d0.
                                super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d0.
                                super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((Item *)local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start == (Item *)0x0) {
          return;
        }
        puVar15 = (undefined1 *)
                  ((long)local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
        goto LAB_0019ad35;
      }
      if (local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_208.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                              super__Vector_impl_data._M_finish);
      }
    }
    if (local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1d0.
                            super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.
                            super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((Item *)local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                super__Vector_impl_data._M_start != (Item *)0x0) {
      operator_delete(local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  local_1b8._0_8_ = (Item *)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"The stone looks blurry. It looks like it won\'t be of any use...",
             "");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this_00->_text,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  if ((Item *)local_1b8._0_8_ == (Item *)(local_1b8 + 0x10)) {
    return;
  }
  puVar15 = (undefined1 *)(local_1a8._M_allocated_capacity + 1);
  local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_1b8._0_8_;
LAB_0019ad35:
  operator_delete(local_1e8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(ulong)puVar15);
  return;
}

Assistant:

void WorldShuffler::randomize_oracle_stone_hint(Item* forbidden_fortune_teller_item)
{
    HintSource* oracle_stone_source = _world.hint_source("Oracle Stone");

    // If hint source already contains text (e.g. through plando descriptor), ignore it
    if(!oracle_stone_source->text().empty())
    {
        _world.add_used_hint_source(oracle_stone_source);
        return;
    }

    if(_world.item_quantity(ITEM_ORACLE_STONE) > 0)
    {
        _world.add_used_hint_source(oracle_stone_source);

        std::vector<Item*> forbidden_items = {
                forbidden_fortune_teller_item, _world.item(ITEM_RED_JEWEL), _world.item(ITEM_PURPLE_JEWEL),
                _world.item(ITEM_GREEN_JEWEL), _world.item(ITEM_BLUE_JEWEL), _world.item(ITEM_YELLOW_JEWEL)
        };

        // Also excluding items strictly needed to get to Oracle Stone's location
        std::vector<ItemSource*> sources = _world.item_sources_with_item(_world.item(ITEM_ORACLE_STONE));
        WorldNode* first_source_node = _world.node(sources.at(0)->node_id());
        if(first_source_node)
        {
            WorldSolver solver(_world);
            if(solver.try_to_solve(_world.spawn_node(), first_source_node, _world.starting_inventory()))
            {
                std::vector<Item*> min_items_to_reach = solver.find_minimal_inventory();
                for(Item* item : min_items_to_reach)
                    if(!vectools::contains(forbidden_items, item))
                        forbidden_items.emplace_back(item);
            }
            else
            {
                dump_json_to_file(_solver.debug_log(), "./debug.json");
                throw LandstalkerException("Could not find minimal inventory to reach Oracle Stone");
            }
        }

        std::vector<Item*> hintable_items;
        for(Item* item : _minimal_items_to_complete)
        {
            if(!vectools::contains(forbidden_items, item))
                hintable_items.emplace_back(item);
        }

        if(!hintable_items.empty())
        {
            vectools::shuffle(hintable_items, _rng);
            Item* hinted_item = *hintable_items.begin();

            std::stringstream oracle_stone_hint;
            oracle_stone_hint << "You will need " << hinted_item->name() << ". It is "
                              << this->random_hint_for_item(hinted_item) << ".";
            oracle_stone_source->text(oracle_stone_hint.str());

            vectools::erase_first(_hintable_item_requirements, hinted_item->id());
            vectools::erase_first(_hintable_item_locations, hinted_item->id());
            return;
        }
    }

    oracle_stone_source->text("The stone looks blurry. It looks like it won't be of any use...");
}